

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

EndsWithMatcher * Catch::Matchers::EndsWith(string *str,Choice caseSensitivity)

{
  CasedString *in_RDI;
  CasedString *in_stack_ffffffffffffffd8;
  EndsWithMatcher *in_stack_ffffffffffffffe0;
  
  StdString::CasedString::CasedString(in_RDI,(string *)in_RDI,Yes);
  StdString::EndsWithMatcher::EndsWithMatcher(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  StdString::CasedString::~CasedString((CasedString *)0x1247d1);
  return (EndsWithMatcher *)in_RDI;
}

Assistant:

StdString::EndsWithMatcher EndsWith( std::string const& str, CaseSensitive::Choice caseSensitivity ) {
        return StdString::EndsWithMatcher( StdString::CasedString( str, caseSensitivity) );
    }